

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FragmentOutputTests::init(FragmentOutputTests *this,EVP_PKEY_CTX *ctx)

{
  Precision precision;
  Context *pCVar1;
  pointer pBVar2;
  deUint32 dVar3;
  int iVar4;
  DataType DVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  char *pcVar8;
  FragmentOutputCase *pFVar9;
  TestNode *pTVar10;
  undefined8 extraout_RAX;
  undefined8 uVar11;
  undefined8 extraout_RAX_00;
  uint uVar12;
  long lVar13;
  Precision *last;
  long lVar14;
  int iVar15;
  undefined1 *first;
  deUint32 *pdVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  value_type local_168;
  _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_158;
  TestNode *local_140;
  TestNode *local_138;
  TestNode *local_130;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  targets;
  vector<glu::DataType,_std::allocator<glu::DataType>_> outTypes;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec;
  DataType basicType;
  FragmentOutputCase *local_b0;
  string precName;
  Random rnd;
  string fmtName;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic fragment output tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x70);
  local_130 = (TestNode *)this;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"float",
             "Floating-point output tests");
  local_138 = pTVar7;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pFVar9 = (FragmentOutputCase *)0x0;
  while (pFVar9 != (FragmentOutputCase *)0x7) {
    dVar3 = init::requiredFloatFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    precName._M_dataplus._M_p._4_4_ = 0x40;
    precName._M_string_length._0_4_ = 0x40;
    precName._M_string_length._4_4_ = 0;
    precName._M_dataplus._M_p._0_4_ = dVar3;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 0xc) break;
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_float");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      lVar14 = lVar14 + 4;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_130->m_testCtx,"fixed","Fixed-point output tests");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pFVar9 = (FragmentOutputCase *)0x0;
  local_138 = pTVar7;
  while (pFVar9 != (FragmentOutputCase *)0x9) {
    dVar3 = init::requiredFixedFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    precName._M_dataplus._M_p._4_4_ = 0x40;
    precName._M_string_length._0_4_ = 0x40;
    precName._M_string_length._4_4_ = 0;
    precName._M_dataplus._M_p._0_4_ = dVar3;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 0xc) break;
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_float");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      lVar14 = lVar14 + 4;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_130->m_testCtx,"int","Integer output tests");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pFVar9 = (FragmentOutputCase *)0x0;
  local_138 = pTVar7;
  while (pFVar9 != (FragmentOutputCase *)0x9) {
    dVar3 = init::requiredIntFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    precName._M_dataplus._M_p._4_4_ = 0x40;
    precName._M_string_length._0_4_ = 0x40;
    precName._M_string_length._4_4_ = 0;
    precName._M_dataplus._M_p._0_4_ = dVar3;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 0xc) break;
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_int");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_INT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_INT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_INT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_INT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      lVar14 = lVar14 + 4;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x70);
  pTVar7 = local_130;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,local_130->m_testCtx,"uint","Usigned integer output tests");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  pFVar9 = (FragmentOutputCase *)0x0;
  local_138 = pTVar10;
  while (pFVar9 != (FragmentOutputCase *)0xa) {
    dVar3 = init::requiredUintFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    precName._M_dataplus._M_p._4_4_ = 0x40;
    precName._M_string_length._0_4_ = 0x40;
    precName._M_string_length._4_4_ = 0;
    precName._M_dataplus._M_p._0_4_ = dVar3;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uint");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_UINT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pTVar7 = local_130;
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,"array","Array outputs");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar7->m_testCtx,"float","Floating-point output tests");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  local_138 = pTVar10;
  for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
    dVar3 = init::requiredFloatFormats[lVar14];
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar15 = 3;
    while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
      precName._M_dataplus._M_p._4_4_ = 0x40;
      precName._M_string_length._0_4_ = 0x40;
      precName._M_string_length._4_4_ = 0;
      precName._M_dataplus._M_p._0_4_ = dVar3;
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    }
    for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar13));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar13));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)pTVar7[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_float");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      local_b0 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      pFVar9 = local_b0;
      FragmentOutputCase::FragmentOutputCase
                (local_b0,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      pTVar7 = local_130;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
  }
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar7->m_testCtx,"fixed","Fixed-point output tests");
  local_138 = pTVar10;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  pFVar9 = (FragmentOutputCase *)0x0;
  while (pFVar9 != (FragmentOutputCase *)0x9) {
    dVar3 = init::requiredFixedFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar15 = 3;
    while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
      precName._M_dataplus._M_p._4_4_ = 0x40;
      precName._M_string_length._0_4_ = 0x40;
      precName._M_string_length._4_4_ = 0;
      precName._M_dataplus._M_p._0_4_ = dVar3;
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    }
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 0xc) break;
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)pTVar7[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_float");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_vec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_FLOAT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      lVar14 = lVar14 + 4;
      pTVar7 = local_130;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar7->m_testCtx,"int","Integer output tests");
  local_138 = pTVar10;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  pFVar9 = (FragmentOutputCase *)0x0;
  while (pFVar9 != (FragmentOutputCase *)0x9) {
    dVar3 = init::requiredIntFormats[(long)pFVar9];
    local_b0 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar15 = 3;
    while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
      precName._M_dataplus._M_p._4_4_ = 0x40;
      precName._M_string_length._0_4_ = 0x40;
      precName._M_string_length._4_4_ = 0;
      precName._M_dataplus._M_p._0_4_ = dVar3;
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    }
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 0xc) break;
      local_140 = (TestNode *)
                  CONCAT44(local_140._4_4_,*(Precision *)((long)init::precisions + lVar14));
      pcVar8 = glu::getPrecisionName(*(Precision *)((long)init::precisions + lVar14));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)pTVar7[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_int");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_INT;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_INT_VEC2;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_INT_VEC3;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_ivec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_INT_VEC4;
      local_168.precision = (Precision)local_140;
      local_168.location = 0;
      local_168.arrayLength = 3;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_138,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      lVar14 = lVar14 + 4;
      pTVar7 = local_130;
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar7->m_testCtx,"uint","Usigned integer output tests");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  local_140 = pTVar10;
  for (lVar14 = 0; lVar14 != 10; lVar14 = lVar14 + 1) {
    dVar3 = init::requiredUintFormats[lVar14];
    pcVar8 = FboTestUtil::getFormatName(dVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,pcVar8,(allocator<char> *)&precName);
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar15 = 3;
    while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
      precName._M_dataplus._M_p._4_4_ = 0x40;
      precName._M_string_length._0_4_ = 0x40;
      precName._M_string_length._4_4_ = 0;
      precName._M_dataplus._M_p._0_4_ = dVar3;
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::emplace_back<deqp::gles3::Functional::BufferSpec>(&fboSpec,(BufferSpec *)&precName);
    }
    pTVar6 = (TestNode *)0x0;
    while (pTVar6 != (TestNode *)0xc) {
      precision = *(Precision *)((long)&pTVar6[0x37def].m_name.field_2 + 8);
      pcVar8 = glu::getPrecisionName(precision);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precName,pcVar8,(allocator<char> *)&targets);
      local_138 = pTVar6;
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uint");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_UINT;
      local_168.location = 0;
      local_168.arrayLength = 3;
      local_168.precision = precision;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_140,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec2");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC2;
      local_168.location = 0;
      local_168.arrayLength = 3;
      local_168.precision = precision;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_140,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec3");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC3;
      local_168.location = 0;
      local_168.arrayLength = 3;
      local_168.precision = precision;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_140,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (Context *)local_130[1]._vptr_TestNode;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &fmtName,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &precName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outTypes,
                     "_uvec4");
      pBVar2 = targets.
               super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.type = TYPE_UINT_VEC4;
      local_168.location = 0;
      local_168.arrayLength = 3;
      local_168.precision = precision;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::push_back((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *)&local_158,&local_168);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&basicType,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)&local_158);
      FragmentOutputCase::FragmentOutputCase
                (pFVar9,pCVar1,(char *)pBVar2,glcts::fixed_sample_locations_values + 1,&fboSpec,
                 (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&basicType);
      tcu::TestNode::addChild(local_140,(TestNode *)pFVar9);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                       *)&basicType);
      std::
      _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~_Vector_base(&local_158);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&outTypes);
      std::__cxx11::string::~string((string *)&rnd);
      std::__cxx11::string::~string((string *)&precName);
      pTVar6 = (TestNode *)((long)&local_138->_vptr_TestNode + 4);
    }
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&fboSpec.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::__cxx11::string::~string((string *)&fmtName);
    pTVar7 = local_130;
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,"random","Random fragment output cases");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  dVar3 = 0;
  uVar11 = extraout_RAX;
  do {
    if (dVar3 == 100) {
      return (int)uVar11;
    }
    pCVar1 = (Context *)pTVar7[1]._vptr_TestNode;
    fboSpec.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fboSpec.
                           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,dVar3);
    local_b0 = (FragmentOutputCase *)CONCAT44(local_b0._4_4_,dVar3);
    deRandom_init(&rnd.m_rnd,dVar3);
    precName._M_dataplus._M_p._0_4_ = 0;
    precName._M_dataplus._M_p._4_4_ = 0;
    precName._M_string_length._0_4_ = 0;
    precName._M_string_length._4_4_ = 0;
    precName.field_2._M_allocated_capacity = 0;
    targets.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    local_140 = (TestNode *)CONCAT44(local_140._4_4_,dVar3 % 3 + 2);
    for (iVar15 = 0; iVar17 = (Precision)local_140 - iVar15,
        iVar17 != 0 && iVar15 <= (int)(Precision)local_140; iVar15 = iVar15 + iVar17) {
      fVar19 = deRandom_getFloat(&rnd.m_rnd);
      iVar4 = 0;
      local_138 = (TestNode *)CONCAT44(local_138._4_4_,fVar19);
      if (fVar19 < 0.3) {
        iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar17);
      }
      basicType = de::Random::choose<glu::DataType,glu::DataType_const*>
                            ((Random *)&rnd.m_rnd,
                             (DataType *)
                             createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::
                             outputTypes,
                             (DataType *)
                             createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::
                             floatFormats);
      fmtName._M_dataplus._M_p._4_4_ =
           de::Random::choose<glu::Precision,glu::Precision_const*>
                     ((Random *)&rnd.m_rnd,init::precisions,
                      (Precision *)"N4deqp5gles310Functional18FragmentOutputCaseE");
      iVar17 = 1;
      if (local_138._0_4_ < 0.3) {
        iVar17 = iVar4;
      }
      fmtName._M_dataplus._M_p._0_4_ = basicType;
      fmtName._M_string_length._0_4_ = iVar15;
      fmtName._M_string_length._4_4_ = iVar4;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::emplace_back<deqp::gles3::Functional::FragmentOutput>
                ((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                  *)&precName,(FragmentOutput *)&fmtName);
      iVar4 = 0;
      if (0 < iVar17) {
        iVar4 = iVar17;
      }
      while (bVar18 = iVar4 != 0, iVar4 = iVar4 + -1, bVar18) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
                   &outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>,
                   &basicType);
      }
    }
    while (lVar14 = (long)targets.
                          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)targets.
                          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4,
          (int)lVar14 < (int)(Precision)local_140) {
      first = createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::floatFormats;
      last = (Precision *)&DAT_018719a0;
      if (outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] - TYPE_FLOAT < 4) {
LAB_0113e994:
        DVar5 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          ((Random *)&rnd.m_rnd,(uint *)first,last);
      }
      else {
        uVar12 = outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14] - TYPE_INT;
        pdVar16 = init::requiredUintFormats;
        if (uVar12 < 4) {
          pdVar16 = init::requiredIntFormats;
        }
        last = init::precisions;
        if (uVar12 < 4) {
          last = (Precision *)&DAT_01871884;
        }
        DVar5 = TYPE_INVALID;
        first = (undefined1 *)pdVar16;
        if (uVar12 < 8) goto LAB_0113e994;
      }
      fmtName._M_dataplus._M_p._4_4_ = 0x80;
      fmtName._M_string_length._0_4_ = 0x40;
      fmtName._M_string_length._4_4_ = 0;
      fmtName._M_dataplus._M_p._0_4_ = DVar5;
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::emplace_back<deqp::gles3::Functional::BufferSpec>(&targets,(BufferSpec *)&fmtName);
    }
    pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
    de::toString<unsigned_int>(&fmtName,(uint *)&fboSpec);
    FragmentOutputCase::FragmentOutputCase
              (pFVar9,pCVar1,
               (char *)CONCAT44(fmtName._M_dataplus._M_p._4_4_,(DataType)fmtName._M_dataplus._M_p),
               glcts::fixed_sample_locations_values + 1,
               (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                *)&targets.
                   super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               ,(vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                 *)&precName);
    std::__cxx11::string::~string((string *)&fmtName);
    std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
              (&outTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>);
    std::
    _Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~_Vector_base(&targets.
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   );
    std::
    _Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
    ::~_Vector_base((_Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                     *)&precName);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pFVar9);
    dVar3 = (int)local_b0 + 1;
    uVar11 = extraout_RAX_00;
    pTVar7 = local_130;
  } while( true );
}

Assistant:

void FragmentOutputTests::init (void)
{
	static const deUint32 requiredFloatFormats[] =
	{
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};
	static const deUint32 requiredFixedFormats[] =
	{
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGB8,
		GL_RGB565,
		GL_RG8,
		GL_R8
	};
	static const deUint32 requiredIntFormats[] =
	{
		GL_RGBA32I,
		GL_RGBA16I,
		GL_RGBA8I,
		GL_RG32I,
		GL_RG16I,
		GL_RG8I,
		GL_R32I,
		GL_R16I,
		GL_R8I
	};
	static const deUint32 requiredUintFormats[] =
	{
		GL_RGBA32UI,
		GL_RGBA16UI,
		GL_RGBA8UI,
		GL_RGB10_A2UI,
		GL_RG32UI,
		GL_RG16UI,
		GL_RG8UI,
		GL_R32UI,
		GL_R16UI,
		GL_R8UI
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	// .basic.
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic fragment output tests");
		addChild(basicGroup);

		const int	width	= 64;
		const int	height	= 64;
		const int	samples	= 0;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		basicGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		basicGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		basicGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		basicGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0)).toVec()));
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Array outputs");
		addChild(arrayGroup);

		const int	width		= 64;
		const int	height		= 64;
		const int	samples		= 0;
		const int	numTargets	= 3;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		arrayGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		arrayGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		arrayGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		arrayGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random fragment output cases");
		addChild(randomGroup);

		for (deUint32 seed = 0; seed < 100; seed++)
			randomGroup->addChild(createRandomCase(m_context, 2, 4, seed));
	}
}